

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O2

bool deqp::gles31::Functional::intEqualsAfterUintCast
               (deInt32 value,deUint32 casted,Precision precision)

{
  bool bVar1;
  byte bVar2;
  int signedIntegerLength;
  long lVar3;
  deUint32 reference;
  uint uVar4;
  
  if (precision < PRECISION_LAST) {
    lVar3 = *(long *)(&DAT_018a5730 + (ulong)precision * 8);
  }
  else {
    lVar3 = 0;
  }
  uVar4 = (uint)(-1L << ((byte)lVar3 & 0x3f));
  if (((casted ^ value) & ~uVar4) == 0) {
    do {
      bVar1 = lVar3 != 0x21;
      if (lVar3 == 0x21) {
        return bVar1;
      }
      bVar2 = (byte)lVar3;
      lVar3 = lVar3 + 1;
    } while (((~(uint)(-1L << (bVar2 & 0x3f)) & value >> 0x1f ^ casted) & uVar4) != 0);
    return bVar1;
  }
  return false;
}

Assistant:

static int getPrecisionNumIntegerBits (glu::Precision precision)
{
	switch (precision)
	{
		case glu::PRECISION_HIGHP:		return 32;
		case glu::PRECISION_MEDIUMP:	return 16;
		case glu::PRECISION_LOWP:		return 9;
		default:
			DE_ASSERT(false);
			return 0;
	}
}